

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

void Saig_SynchInitPisGiven(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords,char *pValues)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int local_40;
  int local_3c;
  int w;
  int i;
  uint *pSim;
  Aig_Obj_t *pObj;
  char *pValues_local;
  int nWords_local;
  Vec_Ptr_t *vSimInfo_local;
  Aig_Man_t *pAig_local;
  
  for (local_3c = 0; iVar1 = Saig_ManPiNum(pAig), local_3c < iVar1; local_3c = local_3c + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,local_3c);
    pvVar3 = Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar3 + 0x24));
    for (local_40 = 0; local_40 < nWords; local_40 = local_40 + 1) {
      uVar2 = Saig_SynchTernary((int)pValues[local_3c]);
      *(uint *)((long)pvVar3 + (long)local_40 * 4) = uVar2;
    }
  }
  return;
}

Assistant:

void Saig_SynchInitPisGiven( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords, char * pValues )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int i, w;
    Saig_ManForEachPi( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = Saig_SynchTernary( pValues[i] );
    }
}